

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.cc
# Opt level: O2

ostream * RVO::operator<<(ostream *stream,Vector2 *vector)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"(");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,vector->x_);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,vector->y_);
  std::operator<<(poVar1,")");
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Vector2 &vector) {
  stream << "(" << vector.x() << "," << vector.y() << ")";

  return stream;
}